

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar_pidd.hpp
# Opt level: O1

void __thiscall astar_pidd::AStarPIDD<Tiles>::AStarPIDD(AStarPIDD<Tiles> *this,Tiles *d)

{
  _Rb_tree_header *p_Var1;
  ostream *poVar2;
  
  (this->super_SearchAlg<Tiles>).dom = d;
  (this->super_SearchAlg<Tiles>).expd = 0;
  (this->super_SearchAlg<Tiles>).gend = 0;
  (this->super_SearchAlg<Tiles>)._vptr_SearchAlg = (_func_int **)&PTR_search_00119a08;
  compress::CompressClosedListAsync<Node<Tiles>_>::CompressClosedListAsync
            (&this->closed,true,true,true,0x3b600000);
  p_Var1 = &(this->open).fg_buckets._M_t._M_impl.super__Rb_tree_header;
  (this->open).fg_buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->open).fg_buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->open).fg_buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->open).fg_buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->open).fg_buckets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  mkdir("open_list_buckets",0x1e4);
  (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->duplicates = 0;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2," concurrent threads are supported.\n",0x23);
  return;
}

Assistant:

AStarPIDD(Domain &d) : SearchAlg<Domain>(d),
            closed(true, true, true, 950_MiB), // TODO: move to user option
            open() {
            std::cout << N_THREADS << " concurrent threads are supported.\n";
        }